

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form4_ExtractChannel(ExtractChannelForm4 ExtractChannel)

{
  uint8_t value;
  bool bVar1;
  uint uVar2;
  pair<unsigned_int,_unsigned_int> *ppVar3;
  pair<unsigned_int,_unsigned_int> pVar4;
  uint32_t roiHeight;
  uint32_t roiWidth;
  undefined1 local_e8 [16];
  pair<unsigned_int,_unsigned_int> *local_d8;
  Image output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,3);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,value,&output);
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  Unit_Test::fillImage(&input,0,0,input._width,input._height,&intensity);
  uVar2 = rand();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_e8,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&output,0,0,(Image *)local_e8);
  local_e8._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_e8);
  ppVar3 = (pair<unsigned_int,_unsigned_int> *)operator_new(0x10);
  local_e8._8_8_ = ppVar3 + 2;
  ppVar3->first = 0;
  ppVar3->second = 0;
  ppVar3[1].first = 0;
  ppVar3[1].second = 0;
  local_e8._0_8_ = ppVar3;
  local_d8 = (pair<unsigned_int,_unsigned_int> *)local_e8._8_8_;
  pVar4 = Unit_Test::imageSize(&input);
  *ppVar3 = pVar4;
  pVar4 = Unit_Test::imageSize(&output);
  ppVar3[1] = pVar4;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi
            ((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_e8,&roiX,&roiY,&roiWidth,&roiHeight);
  (*ExtractChannel)(&input,*roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                    *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,&output,
                    roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[1],
                    roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[1],roiWidth,roiHeight,(uint8_t)(uVar2 % 3));
  bVar1 = Unit_Test::verifyImage
                    (&output,roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start[1],
                     roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[1],roiWidth,roiHeight,
                     intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar2 % 3]);
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pair<unsigned_int,_unsigned_int> *)local_e8._0_8_ != (pair<unsigned_int,_unsigned_int> *)0x0)
  {
    operator_delete((void *)local_e8._0_8_);
  }
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  input._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form4_ExtractChannel(ExtractChannelForm4 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );
        PenguinV_Image::Image output = uniformImage();

        std::vector < std::pair <uint32_t, uint32_t> > size( 2 );
        size[0] = imageSize( input );
        size[1] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        ExtractChannel( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight, channelId );

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, intensity[channelId] );
    }